

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_subset(bcf_hdr_t *h,bcf1_t *v,int n,int *imap)

{
  int32_t x;
  int iVar1;
  int iVar2;
  char *__ptr;
  long lVar3;
  undefined8 uVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bcf_fmt_t *pbVar10;
  bcf_fmt_t *fmt;
  undefined8 uStack_70;
  undefined1 auStack_68 [32];
  kstring_t local_48;
  
  pbVar10 = (bcf_fmt_t *)auStack_68;
  local_48.s = (char *)0x0;
  local_48.l = 0;
  local_48.m = 0;
  uVar8 = *(ulong *)&v->field_0x10;
  if (n == 0) {
    uVar8 = uVar8 & 0xffffffffff;
  }
  else {
    lVar3 = -(ulong)((uint)(uVar8 >> 0x1b) & 0x1fe0);
    pbVar10 = (bcf_fmt_t *)(auStack_68 + lVar3);
    puVar5 = (uint8_t *)(v->indiv).s;
    fmt = pbVar10;
    auStack_68._24_8_ = pbVar10;
    for (uVar7 = 0; uVar7 < (uVar8 >> 0x20 & 0xff); uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)&uStack_70 + lVar3) = 0x117cb9;
      puVar5 = bcf_unpack_fmt_core1(puVar5,(uint)(uVar8 >> 0x28),fmt);
      uVar8 = *(ulong *)&v->field_0x10;
      fmt = fmt + 1;
    }
    uVar9 = 0;
    auStack_68._16_8_ = v;
    uVar7 = (ulong)(uint)n;
    if (n < 1) {
      uVar7 = uVar9;
    }
    while (uVar4 = auStack_68._24_8_, uVar9 < (uVar8 >> 0x20 & 0xff)) {
      x = ((bcf_fmt_t *)(auStack_68._24_8_ + uVar9 * 0x20))->id;
      auStack_68._8_8_ = uVar9;
      *(undefined8 *)((long)&uStack_70 + lVar3) = 0x117cff;
      bcf_enc_int1(&local_48,x);
      iVar1 = ((bcf_fmt_t *)(uVar4 + uVar9 * 0x20))->n;
      iVar2 = ((bcf_fmt_t *)(uVar4 + uVar9 * 0x20))->type;
      *(undefined8 *)((long)&uStack_70 + lVar3) = 0x117d15;
      bcf_enc_size(&local_48,iVar1,iVar2);
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        iVar1 = imap[uVar8];
        if (-1 < iVar1) {
          iVar2 = ((bcf_fmt_t *)(uVar4 + uVar9 * 0x20))->size;
          puVar5 = ((bcf_fmt_t *)(uVar4 + uVar9 * 0x20))->p;
          *(undefined8 *)((long)&uStack_70 + lVar3) = 0x117d3a;
          kputsn((char *)(puVar5 + iVar1 * iVar2),iVar2,&local_48);
        }
      }
      uVar8 = *(ulong *)(auStack_68._16_8_ + 0x10);
      uVar9 = auStack_68._8_8_ + 1;
    }
    uVar9 = 0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      uVar9 = (ulong)(uint)((int)uVar9 - (~imap[uVar6] >> 0x1f));
    }
    uVar8 = uVar8 & 0xffffffffff | uVar9 << 0x28;
    *(ulong *)(auStack_68._16_8_ + 0x10) = uVar8;
    v = (bcf1_t *)auStack_68._16_8_;
    if ((uVar9 & 0xffffff) != 0) goto LAB_00117da0;
  }
  *(ulong *)&v->field_0x10 = uVar8 & 0xffffffff;
LAB_00117da0:
  __ptr = (v->indiv).s;
  *(undefined8 *)&pbVar10[-1].p_len = 0x117da9;
  free(__ptr);
  (v->indiv).s = local_48.s;
  (v->indiv).l = local_48.l;
  (v->indiv).m = local_48.m;
  *(byte *)&v->unpacked = (byte)v->unpacked & 0xf7;
  return 0;
}

Assistant:

int bcf_subset(const bcf_hdr_t *h, bcf1_t *v, int n, int *imap)
{
    kstring_t ind;
    ind.s = 0; ind.l = ind.m = 0;
    if (n) {
        bcf_fmt_t *fmt;
        int i, j;
        fmt = (bcf_fmt_t*)alloca(v->n_fmt * sizeof(bcf_fmt_t));
        uint8_t *ptr = (uint8_t*)v->indiv.s;
        for (i = 0; i < v->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, v->n_sample, &fmt[i]);
        for (i = 0; i < (int)v->n_fmt; ++i) {
            bcf_fmt_t *f = &fmt[i];
            bcf_enc_int1(&ind, f->id);
            bcf_enc_size(&ind, f->n, f->type);
            for (j = 0; j < n; ++j)
                if (imap[j] >= 0) kputsn((char*)(f->p + imap[j] * f->size), f->size, &ind);
        }
        for (i = j = 0; j < n; ++j) if (imap[j] >= 0) ++i;
        v->n_sample = i;
    } else v->n_sample = 0;
    if ( !v->n_sample ) v->n_fmt = 0;
    free(v->indiv.s);
    v->indiv = ind;
    v->unpacked &= ~BCF_UN_FMT;    // only BCF is ready for output, VCF will need to unpack again
    return 0;
}